

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

void __thiscall tcu::Matrix<float,_1,_1>::Matrix(Matrix<float,_1,_1> *this,float *src)

{
  float fVar1;
  float *pfVar2;
  int local_20;
  int local_1c;
  int col;
  int row;
  float *src_local;
  Matrix<float,_1,_1> *this_local;
  
  Vector<tcu::Vector<float,_1>,_1>::Vector(&this->m_data);
  for (local_1c = 0; local_1c < 1; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 1; local_20 = local_20 + 1) {
      fVar1 = src[local_1c + local_20];
      pfVar2 = operator()(this,local_1c,local_20);
      *pfVar2 = fVar1;
    }
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}